

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMyString.cpp
# Opt level: O0

void StringTestMain(void)

{
  uint uVar1;
  char *pcVar2;
  CMyString local_420;
  CMyString *local_18;
  CMyString *tmp;
  CMyString *CS;
  
  tmp = (CMyString *)malloc(0x408);
  InitCMyString(tmp,"hello");
  pcVar2 = GetS(tmp);
  printf("After initCMyString, the string is:%s\n",pcVar2);
  local_18 = (CMyString *)malloc(0x408);
  InitCMyString(local_18,"World.");
  Concatenate(tmp,local_18);
  pcVar2 = GetS(tmp);
  printf("After concatenate, the string is:%s\n",pcVar2);
  InitCMyString(local_18,"NUDT.");
  InsertS(tmp,5,local_18);
  pcVar2 = GetS(tmp);
  printf("After inserting to the pos 5, the string is:%s\n",pcVar2);
  DeleteS(tmp,10,6);
  pcVar2 = GetS(tmp);
  printf("After deleting the substring(pos:10,len:6),the string is:%s\n",pcVar2);
  SubString(&local_420,tmp,5,4);
  memcpy(local_18,&local_420,0x408);
  pcVar2 = GetS(local_18);
  printf("The substring(pos:5,len:4) is:%s\n",pcVar2);
  InitCMyString(local_18,"NUDT");
  uVar1 = Find(tmp,local_18);
  printf("The First occurrence of string NUDT is the pos %d\n",(ulong)uVar1);
  return;
}

Assistant:

void StringTestMain()
{
    CMyString *CS = (CMyString *)malloc(sizeof(CMyString));
    InitCMyString(CS,(char*)"hello");
    printf("After initCMyString, the string is:%s\n",GetS(CS));
    CMyString *tmp = (CMyString *)malloc(sizeof(CMyString));
    InitCMyString(tmp,(char*)"World.");
    Concatenate(CS,tmp);
    printf("After concatenate, the string is:%s\n",GetS(CS));
    InitCMyString(tmp,(char*)"NUDT.");
    InsertS(CS,5,tmp);
    printf("After inserting to the pos 5, the string is:%s\n",GetS(CS));
    DeleteS(CS,10,6);
    printf("After deleting the substring(pos:10,len:6),the string is:%s\n",GetS(CS));
    *tmp = SubString(CS,5,4);
    printf("The substring(pos:5,len:4) is:%s\n",GetS(tmp));
    InitCMyString(tmp,(char*)"NUDT");
    printf("The First occurrence of string NUDT is the pos %d\n",Find(CS,tmp));
}